

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void gen_unary_op(c2m_ctx_t c2m_ctx,node_t_conflict r,op_t *op,op_t *res)

{
  op_t op_00;
  op_t *poVar1;
  node_t_conflict r_00;
  undefined1 auVar2 [64];
  op_t local_f8;
  op_t local_b8;
  op_t local_78;
  MIR_type_t local_2c;
  op_t *poStack_28;
  MIR_type_t t;
  op_t *res_local;
  op_t *op_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  poStack_28 = res;
  res_local = op;
  op_local = (op_t *)r;
  r_local = (node_t_conflict)c2m_ctx;
  if ((*r->attr & 1) == 0) {
    r_00 = DLIST_node_t_head(&(r->u).ops);
    val_gen(&local_78,c2m_ctx,r_00);
    memcpy(op,&local_78,0x40);
    local_2c = get_mir_type((c2m_ctx_t)r_local,*(type **)(*(long *)&op_local->field_0x8 + 0x18));
    poVar1 = res_local;
    auVar2 = vmovdqu64_avx512f((undefined1  [64])*res_local);
    op_00 = (op_t)vmovdqu64_avx512f(auVar2);
    promote(&local_b8,(c2m_ctx_t)r_local,op_00,local_2c,0);
    memcpy(poVar1,&local_b8,0x40);
    poVar1 = poStack_28;
    get_new_temp(&local_f8,(c2m_ctx_t)r_local,local_2c);
    memcpy(poVar1,&local_f8,0x40);
    return;
  }
  __assert_fail("!((struct expr *) r->attr)->const_p",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2a2c,"void gen_unary_op(c2m_ctx_t, node_t, op_t *, op_t *)");
}

Assistant:

static void gen_unary_op (c2m_ctx_t c2m_ctx, node_t r, op_t *op, op_t *res) {
  MIR_type_t t;

  assert (!((struct expr *) r->attr)->const_p);
  *op = val_gen (c2m_ctx, NL_HEAD (r->u.ops));
  t = get_mir_type (c2m_ctx, ((struct expr *) r->attr)->type);
  *op = promote (c2m_ctx, *op, t, FALSE);
  *res = get_new_temp (c2m_ctx, t);
}